

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int gladLoadGL(void)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  pvVar1 = libGL;
  while (libGL = pvVar1,
        libGL = (void *)dlopen((long)&open_gl_NAMES_rel +
                               (long)*(int *)((long)&open_gl_NAMES_rel + lVar3),0x102),
        libGL == (void *)0x0) {
    lVar3 = lVar3 + 4;
    pvVar1 = (void *)0x0;
    if (lVar3 != 4) {
      return 0;
    }
  }
  gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
  if (gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
    return 0;
  }
  iVar2 = gladLoadGLLoader(get_proc);
  if (libGL != (void *)0x0) {
    dlclose();
    libGL = (void *)0x0;
    return iVar2;
  }
  return iVar2;
}

Assistant:

int gladLoadGL(void) {
    int status = 0;

    if(open_gl()) {
        status = gladLoadGLLoader(&get_proc);
        close_gl();
    }

    return status;
}